

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

curl_slist * Curl_cookie_list(Curl_easy *data)

{
  char *data_00;
  curl_slist *pcVar1;
  curl_slist *list;
  Cookie *co;
  
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  co = (Cookie *)data->cookies;
  if ((co != (Cookie *)0x0) && (co->path != (char *)0x0)) {
    pcVar1 = (curl_slist *)0x0;
    do {
      do {
        list = pcVar1;
        co = co->next;
        if (co == (Cookie *)0x0) goto LAB_0010ebf0;
        pcVar1 = list;
      } while (co->domain == (char *)0x0);
      data_00 = get_netscape_format(co);
      if (data_00 == (char *)0x0) goto LAB_0010ebe5;
      pcVar1 = Curl_slist_append_nodup(list,data_00);
    } while (pcVar1 != (curl_slist *)0x0);
    (*Curl_cfree)(data_00);
LAB_0010ebe5:
    curl_slist_free_all(list);
  }
  list = (curl_slist *)0x0;
LAB_0010ebf0:
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return list;
}

Assistant:

struct curl_slist *Curl_cookie_list(struct Curl_easy *data)
{
  struct curl_slist *list;
  Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  list = cookie_list(data);
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
  return list;
}